

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  BuildLog *this_01;
  Metrics *this_02;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long *plVar10;
  Metric *pMVar11;
  long *plVar12;
  bool bVar13;
  pointer ppNVar14;
  string rspfile;
  int end_time;
  int start_time;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  string deps_type;
  ScopedMetric metrics_h_scoped;
  string local_138;
  string *local_118;
  int local_110;
  int local_10c;
  string local_108;
  long *local_e8 [2];
  long local_d8 [2];
  vector<Node_*,_std::allocator<Node_*>_> local_c8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  DependencyScan *local_70;
  Plan *local_68;
  string local_60;
  ScopedMetric local_40;
  
  local_118 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar11 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"FinishCommand","");
      pMVar11 = Metrics::NewMetric(this_02,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    FinishCommand::metrics_h_metric = pMVar11;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"deps","");
  Edge::GetBinding(&local_90,this_00,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"msvc_deps_prefix","");
  Edge::GetBinding(&local_108,this_00,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if (local_90._M_string_length != 0) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    bVar1 = ExtractDeps(this,result,&local_90,&local_108,&local_c8,&local_138);
    if ((!bVar1) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::_M_append((char *)&result->output,(ulong)local_138._M_dataplus._M_p);
      result->status = ExitFailure;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
  }
  BuildStatus::BuildEdgeFinished
            (this->status_,this_00,result->status == ExitSuccess,&result->output,&local_10c,
             &local_110);
  if (result->status != ExitSuccess) {
    bVar1 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_118);
    goto LAB_0010a55f;
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"restat","");
  bVar1 = Edge::GetBindingBool(this_00,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if (this->config_[4] == (BuildConfig)0x0) {
    ppNVar14 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    bVar3 = ppNVar14 ==
            (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar3) {
      lVar8 = 0;
      bVar13 = false;
    }
    else {
      local_68 = &this->plan_;
      local_70 = &this->scan_;
      bVar13 = false;
      lVar8 = 0;
      do {
        lVar5 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                          (this->disk_interface_,*ppNVar14,local_118);
        if (lVar5 == -1) {
          bVar2 = false;
        }
        else {
          if (lVar8 < lVar5) {
            lVar8 = lVar5;
          }
          bVar2 = true;
          if (((*ppNVar14)->mtime_ == lVar5 && bVar1) &&
             (bVar2 = Plan::CleanNode(local_68,local_70,*ppNVar14,local_118), bVar2)) {
            bVar13 = true;
          }
        }
        if (bVar2 == false) break;
        ppNVar14 = ppNVar14 + 1;
        bVar3 = ppNVar14 ==
                (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      } while (!bVar3);
    }
    if ((bVar3) && (bVar13)) {
      ppNVar14 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      bVar1 = ppNVar14 ==
              (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
      if (bVar1) {
        lVar5 = 0;
      }
      else {
        lVar5 = 0;
        do {
          lVar6 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                            (this->disk_interface_,*ppNVar14,local_118);
          lVar7 = lVar5;
          if (lVar5 < lVar6) {
            lVar7 = lVar6;
          }
          if (lVar6 == -1) break;
          ppNVar14 = ppNVar14 + 1;
          bVar1 = ppNVar14 ==
                  (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
          lVar5 = lVar7;
        } while (!bVar1);
      }
      if (bVar1) {
        Edge::GetUnescapedDepfile_abi_cxx11_(&local_138,this_00);
        if (lVar5 == 0) {
          lVar5 = 0;
LAB_0010a30c:
          this->status_->total_edges_ = (this->plan_).command_edges_;
          bVar3 = true;
        }
        else {
          if ((local_90._M_string_length != 0) || (local_138._M_string_length == 0))
          goto LAB_0010a30c;
          lVar7 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                            (this->disk_interface_,&local_138,local_118);
          if (lVar5 < lVar7) {
            lVar5 = lVar7;
          }
          if (lVar7 != -1) goto LAB_0010a30c;
          bVar3 = false;
          lVar5 = lVar8;
        }
        lVar8 = lVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar3 = false;
      }
    }
    if (bVar3) goto LAB_0010a34a;
  }
  else {
    lVar8 = 0;
LAB_0010a34a:
    bVar1 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_118);
    if (bVar1) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&local_138,this_00);
      if ((local_138._M_string_length != 0) && (g_keep_rsp == false)) {
        (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,&local_138);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar1 = BuildLog::RecordCommand(this_01,this_00,local_10c,local_110,lVar8), bVar1)) {
        bVar1 = true;
        if ((local_90._M_string_length != 0) && (this->config_[4] == (BuildConfig)0x0)) {
          ppNVar14 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if (ppNVar14 ==
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                          ,0x40b,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          if (ppNVar14 !=
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              lVar8 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                                (this->disk_interface_,*ppNVar14,local_118);
              bVar1 = lVar8 != -1;
              if (lVar8 == -1) break;
              bVar3 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,*ppNVar14,lVar8,
                                          &local_c8);
              if (!bVar3) {
                local_e8[0] = local_d8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_e8,"Error writing to deps log: ","");
                piVar9 = __errno_location();
                strerror(*piVar9);
                plVar10 = (long *)std::__cxx11::string::append((char *)local_e8);
                goto LAB_0010a4b0;
              }
              ppNVar14 = ppNVar14 + 1;
            } while (ppNVar14 !=
                     (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_finish);
          }
        }
      }
      else {
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e8,"Error writing to build log: ","");
        piVar9 = __errno_location();
        strerror(*piVar9);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_e8);
LAB_0010a4b0:
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_a0 = *plVar12;
          lStack_98 = plVar10[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar12;
          local_b0 = (long *)*plVar10;
        }
        local_a8 = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_118,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        bVar1 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0010a55f;
    }
  }
  bVar1 = false;
LAB_0010a55f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar1;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}